

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.c
# Opt level: O0

void emitfromone(opcodetype opcode,char *label,int tabindex)

{
  int iVar1;
  datatype dVar2;
  char local_26 [8];
  char source [10];
  int tabindex_local;
  char *label_local;
  opcodetype opcode_local;
  
  source._2_4_ = tabindex;
  unique0x100000e5 = label;
  getlabel(tabindex,local_26);
  fprintf((FILE *)ofp,"         %-10s%s, ",opcodestr[opcode],stack0xffffffffffffffe8);
  iVar1 = strncmp(local_26,"[bp",3);
  if (iVar1 == 0) {
    dVar2 = data_class(source._2_4_);
    if (dVar2 == dtreal) {
      putc(100,(FILE *)ofp);
    }
    fprintf((FILE *)ofp,"word ptr ");
  }
  fprintf((FILE *)ofp,"%s\n",local_26);
  return;
}

Assistant:

void    emitfromone(enum opcodetype opcode, char *label, int tabindex)
{
    char    source[LABELSIZE];
    
    getlabel(tabindex, source);
    
    fprintf(ofp, "         %-10s%s, ", opcodestr[opcode], label);
    if (strncmp(source, "[bp", 3) == 0)    {
        if (data_class(tabindex) == dtreal)
            putc('d', ofp);
        fprintf(ofp, "word ptr ");
    }
    
    fprintf(ofp, "%s\n", source);
}